

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5StorageDelete(Fts5Storage *p,i64 iDel,sqlite3_value **apVal,int bSaveRow)

{
  int *pRc;
  u8 uVar1;
  uint uVar2;
  Fts5Config *pFVar3;
  Fts5Config *pConfig;
  sqlite3_stmt *psVar4;
  Fts5Index *p_00;
  u8 *puVar5;
  bool bVar6;
  ulong uVar7;
  Fts5Storage *pStmt;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Mem *pMem;
  ulong uVar12;
  sqlite3_value *pVal;
  Fts5Structure *pStruct;
  Fts5Data *pPg;
  Fts5Data **ap;
  Fts5Data *pFVar13;
  u64 iRowid;
  int iVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  Fts5Data *p_01;
  ulong uVar21;
  Fts5Data **ap_00;
  Fts5StructureSegment *pFVar22;
  ulong uVar23;
  long in_FS_OFFSET;
  bool bVar24;
  sqlite3_stmt *pDel;
  char *pLoc;
  int nText;
  char *pText;
  sqlite3_stmt *pSeek;
  int local_120;
  long local_d8;
  sqlite3_stmt *local_80;
  int local_74;
  uchar *local_70;
  int local_64;
  char *local_60;
  Fts5Storage *local_58;
  undefined8 uStack_50;
  sqlite3_stmt *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar3 = p->pConfig;
  local_80 = (sqlite3_stmt *)0x0;
  uVar8 = fts5StorageLoadTotals(p,1);
  if (uVar8 == 0) {
    uVar8 = sqlite3Fts5IndexBeginWrite(p->pIndex,1,iDel);
  }
  if (uVar8 == 0) {
    pConfig = p->pConfig;
    if (pConfig->bContentlessDelete == 0) {
      local_40 = (sqlite3_stmt *)0x0;
      local_58 = (Fts5Storage *)&DAT_aaaaaaaaaaaaaaaa;
      uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      if (apVal == (sqlite3_value **)0x0) {
        psVar4 = p->pSavedRow;
        if (bSaveRow == 0 || psVar4 == (sqlite3_stmt *)0x0) {
          uVar8 = fts5StorageGetStmt(p,bSaveRow + 2,&local_40,(char **)0x0);
          psVar4 = local_40;
          if (uVar8 != 0) goto LAB_001ef08d;
          sqlite3_bind_int64(local_40,1,iDel);
          iVar9 = sqlite3_step(psVar4);
          if (iVar9 != 100) {
            uVar8 = sqlite3_reset(psVar4);
            goto LAB_001ef08d;
          }
        }
        else {
          p->pSavedRow = (sqlite3_stmt *)0x0;
          local_40 = psVar4;
        }
      }
      psVar4 = local_40;
      uStack_50 = (undefined1 *)CONCAT44(uStack_50._4_4_,0xffffffff);
      local_58 = p;
      if (pConfig->nCol < 1) {
        uVar17 = 0;
      }
      else {
        lVar18 = 0;
        do {
          uVar17 = 0;
          if (pConfig->abUnindexed[lVar18] == '\0') {
            local_60 = (char *)0x0;
            local_64 = 0;
            local_70 = (uchar *)0x0;
            local_74 = 0;
            iVar9 = (int)lVar18;
            if (psVar4 == (sqlite3_stmt *)0x0) {
              pVal = apVal[lVar18];
            }
            else {
              pVal = sqlite3_column_value(psVar4,iVar9 + 1);
            }
            if ((pConfig->bLocale == 0) ||
               (iVar10 = sqlite3Fts5IsLocaleValue(pConfig,pVal), iVar10 == 0)) {
              local_60 = (char *)sqlite3ValueText(pVal,'\x01');
              local_64 = sqlite3ValueBytes(pVal,'\x01');
              uVar17 = 0;
              if ((psVar4 != (sqlite3_stmt *)0x0) && (pConfig->bLocale != 0)) {
                local_70 = sqlite3_column_text(psVar4,pConfig->nCol + iVar9 + 1);
                local_74 = sqlite3_column_bytes(psVar4,pConfig->nCol + iVar9 + 1);
              }
            }
            else {
              uVar17 = sqlite3Fts5DecodeLocaleValue
                                 (pVal,&local_60,&local_64,(char **)&local_70,&local_74);
            }
            if (uVar17 == 0) {
              (pConfig->t).pLocale = (char *)local_70;
              (pConfig->t).nLocale = local_74;
              uStack_50 = (undefined1 *)((ulong)uStack_50 & 0xffffffff);
              uVar8 = sqlite3Fts5Tokenize(pConfig,4,local_60,local_64,&local_58,
                                          fts5StorageInsertCallback);
              lVar19 = p->aTotalSize[lVar18] - (long)uStack_50._4_4_;
              p->aTotalSize[lVar18] = lVar19;
              uVar17 = (uint)(lVar19 >> 0x3f) & 0x10b;
              if (uVar8 != 0) {
                uVar17 = uVar8;
              }
              (pConfig->t).pLocale = (char *)0x0;
              (pConfig->t).nLocale = 0;
            }
          }
          if (uVar17 != 0) goto LAB_001efae1;
          lVar18 = lVar18 + 1;
        } while (lVar18 < pConfig->nCol);
      }
      if (p->nTotalRow < 1) {
        uVar17 = 0x10b;
      }
      else {
LAB_001efae1:
        p->nTotalRow = p->nTotalRow + -1;
      }
      if ((bSaveRow == 0) || (uVar17 != 0)) {
        uVar8 = sqlite3_reset(psVar4);
        if (uVar17 != 0) {
          uVar8 = uVar17;
        }
      }
      else {
        p->pSavedRow = psVar4;
        uVar8 = 0;
      }
    }
    else {
      local_58 = (Fts5Storage *)0x0;
      uVar12 = 0;
      uVar8 = fts5StorageGetStmt(p,9,(sqlite3_stmt **)&local_58,(char **)0x0);
      pStmt = local_58;
      if (uVar8 == 0) {
        sqlite3_bind_int64((sqlite3_stmt *)local_58,1,iDel);
        iVar9 = sqlite3_step((sqlite3_stmt *)pStmt);
        if (iVar9 == 100) {
          pMem = columnMem((sqlite3_stmt *)pStmt,1);
          uVar12 = sqlite3VdbeIntValue(pMem);
          columnMallocFailure((sqlite3_stmt *)pStmt);
        }
        else {
          uVar12 = 0;
        }
        uVar8 = sqlite3_reset((sqlite3_stmt *)pStmt);
      }
      if (uVar12 != 0 && uVar8 == 0) {
        p_00 = p->pIndex;
        pStruct = fts5StructureRead(p_00);
        if (pStruct != (Fts5Structure *)0x0) {
          if (0 < (long)pStruct->nLevel) {
            pRc = &p_00->rc;
            bVar24 = false;
            local_d8 = (long)pStruct->nLevel;
            do {
              lVar18 = (long)pStruct->aLevel[local_d8 + -1].nSeg;
              if (0 < lVar18) {
                do {
                  lVar19 = lVar18 + -1;
                  pFVar22 = pStruct->aLevel[local_d8 + -1].aSeg;
                  if ((pFVar22[lVar19].iOrigin1 <= uVar12) &&
                     (pFVar22 = pFVar22 + lVar19, uVar12 <= pFVar22->iOrigin2)) {
                    if (!bVar24) {
                      pFVar22->nEntryTombstone = pFVar22->nEntryTombstone + 1;
                    }
                    p_00->nContentlessDelete = p_00->nContentlessDelete + 1;
                    if ((long)pFVar22->nPgTombstone < 1) {
                      uVar16 = 0xffffffff;
                      pPg = (Fts5Data *)0x0;
LAB_001ef5c3:
                      if (pPg == (Fts5Data *)0x0) {
                        iVar9 = 4;
                      }
                      else {
                        iVar9 = (uint)(*pPg->p != '\x04') * 4 + 4;
                      }
                      if ((ulong)iDel >> 0x20 != 0) {
                        iVar9 = 8;
                      }
                      iVar10 = (p_00->pConfig->pgsz + -8) / iVar9;
                      if (iVar10 < 0x21) {
                        iVar10 = 0x20;
                      }
                      iVar11 = pFVar22->nPgTombstone;
                      uVar8 = 0;
                      if (iVar11 == 0) {
                        iVar15 = 0x20;
                        bVar24 = false;
                      }
                      else if (iVar11 == 1) {
                        uVar17 = *(uint *)(pPg->p + 4);
                        iVar14 = (uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8
                                 | uVar17 << 0x18) * 4;
                        iVar15 = 0x20;
                        if (0x20 < iVar14) {
                          iVar15 = iVar14;
                        }
                        bVar24 = iVar10 < iVar14;
                      }
                      else {
                        iVar15 = 0;
                        bVar24 = true;
                      }
                      uVar17 = iVar11 * 2 + 1;
                      local_120 = iVar10;
                      if (!bVar24) {
                        uVar17 = 1;
                        local_120 = iVar15;
                      }
                      ap_00 = (Fts5Data **)0x0;
                      do {
                        ap = (Fts5Data **)sqlite3Fts5MallocZero(pRc,(long)(int)uVar17 * 8);
                        if (0 < (int)uVar17) {
                          uVar23 = 0;
                          do {
                            pFVar13 = (Fts5Data *)
                                      sqlite3Fts5MallocZero(pRc,(long)(local_120 * iVar9) + 0x18);
                            if (pFVar13 != (Fts5Data *)0x0) {
                              pFVar13->nn = local_120 * iVar9 + 8;
                              pFVar13->p = (u8 *)(pFVar13 + 1);
                              ap[uVar23] = pFVar13;
                            }
                            uVar23 = uVar23 + 1;
                          } while (uVar17 != uVar23);
                        }
                        if (*pRc == 0) {
                          if (0 < (int)uVar17) {
                            uVar23 = 0;
                            do {
                              *ap[uVar23]->p = (u8)iVar9;
                              puVar5 = ap[uVar23]->p;
                              uVar23 = uVar23 + 1;
                              puVar5[4] = '\0';
                              puVar5[5] = '\0';
                              puVar5[6] = '\0';
                              puVar5[7] = '\0';
                            } while (uVar17 != uVar23);
                          }
                          if (0 < pFVar22->nPgTombstone) {
                            uVar23 = 0;
                            do {
                              if (uVar23 == (uVar16 & 0xffffffff)) {
                                pFVar13 = pPg;
                                p_01 = (Fts5Data *)0x0;
                              }
                              else {
                                pFVar13 = fts5DataRead(p_00,((ulong)(pFVar22->iSegid + 0x10000) <<
                                                            0x25) + uVar23);
                                p_01 = pFVar13;
                              }
                              if (pFVar13 == (Fts5Data *)0x0) {
                                iVar11 = 0;
                              }
                              else {
                                uVar1 = *pFVar13->p;
                                uVar7 = (long)(pFVar13->nn + -8) /
                                        (long)(int)((uint)(uVar1 != '\x04') * 4 + 4);
                                if ((int)uVar7 < 1) {
                                  iVar11 = 0;
                                }
                                else {
                                  lVar20 = 0;
                                  iVar11 = 0;
                                  uVar21 = 1;
                                  do {
                                    puVar5 = pFVar13->p;
                                    if (uVar1 == '\x04') {
                                      if (*(int *)(puVar5 + uVar21 * 4 + 4) == 0) {
LAB_001ef85a:
                                        iRowid = 0;
                                      }
                                      else {
                                        uVar2 = *(uint *)(puVar5 + uVar21 * 4 + 4);
                                        iRowid = (u64)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 |
                                                       (uVar2 & 0xff00) << 8 | uVar2 << 0x18);
                                      }
                                    }
                                    else {
                                      if (*(long *)(puVar5 + lVar20 + 8) == 0) goto LAB_001ef85a;
                                      iRowid = fts5GetU64(puVar5 + lVar20 + 8);
                                    }
                                    if (iRowid == 0) {
                                      bVar24 = true;
                                    }
                                    else {
                                      iVar11 = fts5IndexTombstoneAddToPage
                                                         (ap[iRowid % (ulong)(long)(int)uVar17],0,
                                                          uVar17,iRowid);
                                      bVar24 = iVar11 == 0;
                                    }
                                    if (!bVar24) break;
                                    lVar20 = lVar20 + 8;
                                    bVar24 = uVar21 < (uVar7 & 0xffffffff);
                                    uVar21 = uVar21 + 1;
                                  } while (bVar24);
                                }
                                if (uVar23 == 0) {
                                  (*ap)->p[1] = pFVar13->p[1];
                                }
                              }
                              sqlite3_free(p_01);
                              if (iVar11 != 0) {
                                fts5IndexFreeArray(ap,uVar17);
                                uVar17 = uVar17 * 2 + 1;
                                bVar24 = true;
                                local_120 = iVar10;
                                goto LAB_001ef965;
                              }
                              uVar23 = uVar23 + 1;
                            } while ((long)uVar23 < (long)pFVar22->nPgTombstone);
                          }
                        }
                        if (*pRc == 0) {
                          bVar24 = false;
                          ap_00 = ap;
                          uVar8 = uVar17;
                        }
                        else {
                          fts5IndexFreeArray(ap,uVar17);
                          uVar17 = 0;
                          bVar24 = false;
                          ap_00 = (Fts5Data **)0x0;
                          uVar8 = 0;
                        }
LAB_001ef965:
                      } while (bVar24);
                      if (uVar8 != 0) {
                        fts5IndexTombstoneAddToPage
                                  (ap_00[(ulong)iDel % (ulong)(long)(int)uVar8],1,uVar8,iDel);
                        if (0 < (int)uVar8) {
                          uVar16 = 0;
                          do {
                            fts5DataWrite(p_00,((ulong)(pFVar22->iSegid + 0x10000) << 0x25) + uVar16
                                          ,ap_00[uVar16]->p,ap_00[uVar16]->nn);
                            uVar16 = uVar16 + 1;
                          } while (uVar8 != uVar16);
                        }
                        pFVar22->nPgTombstone = uVar8;
                        fts5StructureWrite(p_00,p_00->pStruct);
                      }
                      sqlite3_free(pPg);
                      fts5IndexFreeArray(ap_00,uVar8);
                    }
                    else {
                      uVar16 = (ulong)iDel % (ulong)(long)pFVar22->nPgTombstone;
                      pPg = fts5DataRead(p_00,(ulong)(pFVar22->iSegid + 0x10000) << 0x25 | uVar16);
                      if (pPg != (Fts5Data *)0x0) {
                        iVar9 = fts5IndexTombstoneAddToPage(pPg,0,pFVar22->nPgTombstone,iDel);
                        if (iVar9 != 0) goto LAB_001ef5c3;
                        fts5DataWrite(p_00,(ulong)(pFVar22->iSegid + 0x10000) << 0x25 | uVar16,
                                      pPg->p,pPg->nn);
                        sqlite3_free(pPg);
                      }
                    }
                    bVar24 = true;
                  }
                  bVar6 = 1 < lVar18;
                  lVar18 = lVar19;
                } while (bVar6);
              }
              bVar6 = 1 < local_d8;
              local_d8 = local_d8 + -1;
            } while (bVar6);
          }
          fts5StructureRelease(pStruct);
        }
        uVar8 = p_00->rc;
        p_00->rc = 0;
      }
      if (((bSaveRow != 0) && (uVar8 == 0)) && (uVar8 = 0, p->pConfig->eContent == 3)) {
        uVar8 = sqlite3Fts5StorageFindDeleteRow(p,iDel);
      }
    }
  }
LAB_001ef08d:
  if (uVar8 == 0) {
    if (pFVar3->bColumnsize == 0) {
      uVar8 = 0;
    }
    else {
      uVar8 = fts5StorageGetStmt(p,8,&local_80,(char **)0x0);
      psVar4 = local_80;
      if (uVar8 == 0) {
        sqlite3_bind_int64(local_80,1,iDel);
        sqlite3_step(psVar4);
        uVar8 = sqlite3_reset(psVar4);
      }
    }
  }
  iVar9 = pFVar3->eContent;
  if ((iVar9 == 3) || (iVar9 == 0)) {
    if (uVar8 == 0) {
      uVar8 = fts5StorageGetStmt(p,6,&local_80,(char **)0x0);
    }
    psVar4 = local_80;
    if (uVar8 == 0) {
      sqlite3_bind_int64(local_80,1,iDel);
      sqlite3_step(psVar4);
      uVar8 = sqlite3_reset(psVar4);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar8;
}

Assistant:

static int sqlite3Fts5StorageDelete(
  Fts5Storage *p,                 /* Storage object */
  i64 iDel,                       /* Rowid to delete from table */
  sqlite3_value **apVal,          /* Optional - values to remove from index */
  int bSaveRow                    /* If true, set pSavedRow for deleted row */
){
  Fts5Config *pConfig = p->pConfig;
  int rc;
  sqlite3_stmt *pDel = 0;

  assert( pConfig->eContent!=FTS5_CONTENT_NORMAL || apVal==0 );
  rc = fts5StorageLoadTotals(p, 1);

  /* Delete the index records */
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5IndexBeginWrite(p->pIndex, 1, iDel);
  }

  if( rc==SQLITE_OK ){
    if( p->pConfig->bContentlessDelete ){
      rc = fts5StorageContentlessDelete(p, iDel);
      if( rc==SQLITE_OK
       && bSaveRow
       && p->pConfig->eContent==FTS5_CONTENT_UNINDEXED
      ){
        rc = sqlite3Fts5StorageFindDeleteRow(p, iDel);
      }
    }else{
      rc = fts5StorageDeleteFromIndex(p, iDel, apVal, bSaveRow);
    }
  }

  /* Delete the %_docsize record */
  if( rc==SQLITE_OK && pConfig->bColumnsize ){
    rc = fts5StorageGetStmt(p, FTS5_STMT_DELETE_DOCSIZE, &pDel, 0);
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(pDel, 1, iDel);
      sqlite3_step(pDel);
      rc = sqlite3_reset(pDel);
    }
  }

  /* Delete the %_content record */
  if( pConfig->eContent==FTS5_CONTENT_NORMAL
   || pConfig->eContent==FTS5_CONTENT_UNINDEXED
  ){
    if( rc==SQLITE_OK ){
      rc = fts5StorageGetStmt(p, FTS5_STMT_DELETE_CONTENT, &pDel, 0);
    }
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(pDel, 1, iDel);
      sqlite3_step(pDel);
      rc = sqlite3_reset(pDel);
    }
  }

  return rc;
}